

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_io_write(jit_State *J,RecordFFData *rd)

{
  IRIns *pIVar1;
  IRRef1 IVar2;
  IROpT IVar3;
  TRef TVar4;
  TRef TVar5;
  TRef TVar6;
  TRef TVar7;
  TRef TVar8;
  TRef TVar9;
  TRef *pTVar10;
  ulong uVar11;
  long lVar12;
  TRef ud;
  TRef local_34;
  
  TVar4 = recff_io_fp(J,&local_34,rd->data);
  TVar5 = lj_ir_kint(J,0);
  TVar6 = lj_ir_kint(J,1);
  uVar11 = (ulong)(rd->data == 0);
  pTVar10 = J->base;
  TVar7 = pTVar10[uVar11];
  if (TVar7 != 0) {
    lVar12 = uVar11 * 4;
    do {
      lVar12 = lVar12 + 4;
      TVar7 = lj_ir_tostr(J,TVar7);
      (J->fold).ins.field_0.ot = 0x4009;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
      TVar8 = lj_opt_fold(J);
      (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130000;
      TVar9 = lj_opt_fold(J);
      if (((short)TVar9 < 0) || (pIVar1 = (J->cur).ir, pIVar1[TVar9 & 0x7fff].field_1.op12 != 1)) {
        TVar7 = lj_ir_call(J,IRCALL_fwrite,(ulong)TVar8,(ulong)TVar6,(ulong)TVar9,(ulong)TVar4);
        IVar2 = (IRRef1)TVar7;
        uVar11 = J->L->base[-1].u64;
        IVar3 = 0x893;
        if (((uVar11 & 3) != 0) || (*(char *)(uVar11 - 1) != '\x01')) goto LAB_001387ca;
      }
      else {
        uVar11 = (ulong)(TVar7 & 0xffff);
        if ((*(char *)((long)pIVar1 + uVar11 * 8 + 5) == ']') &&
           (*(short *)((long)pIVar1 + uVar11 * 8 + 2) == 2)) {
          uVar11 = (ulong)pIVar1[uVar11].field_0.op1;
        }
        else {
          (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x46100001;
          TVar7 = lj_opt_fold(J);
          uVar11 = (ulong)TVar7;
        }
        TVar7 = lj_ir_call(J,IRCALL_fputc,uVar11,(ulong)TVar4);
        IVar2 = (IRRef1)TVar7;
        uVar11 = J->L->base[-1].u64;
        if (((uVar11 & 3) != 0) || (*(char *)(uVar11 - 1) != '\x01')) {
          TVar9 = lj_ir_kint(J,-1);
          IVar3 = 0x993;
LAB_001387ca:
          (J->fold).ins.field_0.ot = IVar3;
          (J->fold).ins.field_0.op1 = IVar2;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
          lj_opt_fold(J);
        }
      }
      pTVar10 = J->base;
      TVar7 = *(TRef *)((long)pTVar10 + lVar12);
    } while (TVar7 != 0);
  }
  *pTVar10 = 0x2007ffd;
  return;
}

Assistant:

static void LJ_FASTCALL recff_io_write(jit_State *J, RecordFFData *rd)
{
  TRef ud, fp = recff_io_fp(J, &ud, rd->data);
  TRef zero = lj_ir_kint(J, 0);
  TRef one = lj_ir_kint(J, 1);
  ptrdiff_t i = rd->data == 0 ? 1 : 0;
  for (; J->base[i]; i++) {
    TRef str = lj_ir_tostr(J, J->base[i]);
    TRef buf = emitir(IRT(IR_STRREF, IRT_PGC), str, zero);
    TRef len = emitir(IRTI(IR_FLOAD), str, IRFL_STR_LEN);
    if (tref_isk(len) && IR(tref_ref(len))->i == 1) {
      IRIns *irs = IR(tref_ref(str));
      TRef tr = (irs->o == IR_TOSTR && irs->op2 == IRTOSTR_CHAR) ?
		irs->op1 :
		emitir(IRT(IR_XLOAD, IRT_U8), buf, IRXLOAD_READONLY);
      tr = lj_ir_call(J, IRCALL_fputc, tr, fp);
      if (results_wanted(J) != 0)  /* Check result only if not ignored. */
	emitir(IRTGI(IR_NE), tr, lj_ir_kint(J, -1));
    } else {
      TRef tr = lj_ir_call(J, IRCALL_fwrite, buf, one, len, fp);
      if (results_wanted(J) != 0)  /* Check result only if not ignored. */
	emitir(IRTGI(IR_EQ), tr, len);
    }
  }
  J->base[0] = LJ_52 ? ud : TREF_TRUE;
}